

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::detail::checkIfShouldThrow(Enum at)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((at & is_require) == 0) {
    if ((((at & is_check) != 0) && (0 < *(int *)(g_cs + 0x6c))) &&
       (iVar1 = *(int *)(g_cs + 0xa0),
       iVar2 = MultiLaneAtomic::operator_cast_to_int((MultiLaneAtomic<int> *)(g_cs + 0x8c0)),
       *(int *)(g_cs + 0x6c) <= iVar2 + iVar1)) {
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool checkIfShouldThrow(assertType::Enum at) {
        if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
            return true;

        if((at & assertType::is_check) //!OCLINT bitwise operator in conditional
           && getContextOptions()->abort_after > 0 &&
           (g_cs->numAssertsFailed + g_cs->numAssertsFailedCurrentTest_atomic) >=
                   getContextOptions()->abort_after)
            return true;

        return false;
    }